

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

deUint32 vkt::api::anon_unknown_1::Image::getMaxConcurrent(Context *context,Parameters *params)

{
  Resources *this;
  RefData<vk::Handle<(vk::HandleType)9>_> data;
  deUint32 dVar1;
  Handle<(vk::HandleType)9> *pHVar2;
  VkDeviceSize deviceMemoryUsage;
  undefined1 local_e0 [8];
  VkMemoryRequirements memReqs;
  Move<vk::Handle<(vk::HandleType)9>_> local_b8;
  RefData<vk::Handle<(vk::HandleType)9>_> local_98;
  undefined1 local_78 [8];
  Unique<vk::Handle<(vk::HandleType)9>_> image;
  undefined1 local_50 [7];
  Resources res;
  Environment env;
  Parameters *params_local;
  Context *context_local;
  
  Environment::Environment((Environment *)local_50,context,1);
  this = (Resources *)
         ((long)&image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator + 7)
  ;
  Resources::Resources(this,(Environment *)local_50,params);
  create(&local_b8,(Environment *)local_50,this,params);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_98,(Move *)&local_b8);
  data.deleter.m_deviceIface = local_98.deleter.m_deviceIface;
  data.object.m_internal = local_98.object.m_internal;
  data.deleter.m_device = local_98.deleter.m_device;
  data.deleter.m_allocator = local_98.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)9>_> *)local_78,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_b8);
  pHVar2 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_78);
  ::vk::getImageMemoryRequirements
            ((VkMemoryRequirements *)local_e0,(DeviceInterface *)env.vkp,(VkDevice)env.vkd,
             (VkImage)pHVar2->m_internal);
  deviceMemoryUsage = getPageTableSize(context,(VkDeviceSize)local_e0);
  dVar1 = getSafeObjectCount<vkt::api::(anonymous_namespace)::Image>
                    (context,params,0x4000,deviceMemoryUsage);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)9>_> *)local_78);
  return dVar1;
}

Assistant:

static deUint32 getMaxConcurrent (Context& context, const Parameters& params)
	{
		const Environment			env		(context, 1u);
		const Resources				res		(env, params);
		const Unique<VkImage>		image	(create(env, res, params));
		const VkMemoryRequirements	memReqs	= getImageMemoryRequirements(env.vkd, env.device, *image);

		return getSafeObjectCount<Image>(context,
										 params,
										 DEFAULT_MAX_CONCURRENT_OBJECTS,
										 getPageTableSize(context, memReqs.size));
	}